

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::Base(Base *this,ListRecord *list)

{
  undefined1 auVar1 [16];
  double dVar2;
  pointer pdVar3;
  long lVar4;
  drop_exactly_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>
  dStack_48;
  
  *(undefined8 *)
   &(this->super_ListRecord).metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> =
       (list->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->super_ListRecord).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> +
  8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(list->metadata).fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> + 8))->
       _M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->super_ListRecord).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> +
  0x10))->_M_head_impl =
       (list->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  dVar2 = (list->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  (this->super_ListRecord).metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (list->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  (this->super_ListRecord).metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar2;
  (this->super_ListRecord).metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (list->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  dStack_48.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
  super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>.rng_.rng_ =
       &(this->super_ListRecord).data;
  pdVar3 = (list->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (list->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar3;
  (this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (list->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (list->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (list->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (list->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dStack_48.n_ = (this->super_ListRecord).metadata.fields.
                 super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                 super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                 _M_head_impl;
  lVar4 = (long)(this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  dStack_48.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.stride_ =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(this->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl + 2;
  auVar1._8_8_ = lVar4 >> 0x3f;
  auVar1._0_8_ = lVar4 >> 3;
  lVar4 = SUB168(auVar1 % SEXT816(dStack_48.rng_.
                                  super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>
                                  .stride_),0);
  dStack_48.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.offset_ =
       dStack_48.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.stride_
       - lVar4;
  if (lVar4 == 0) {
    dStack_48.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.offset_ = 0
    ;
  }
  verifySorted<ranges::drop_exactly_view<ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>>,char[7]>
            (&dStack_48,(char (*) [7])"Energy");
  verifySize((int)((ulong)((long)(this->super_ListRecord).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->super_ListRecord).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3),
             (int)((_Head_base<3UL,_long,_false> *)
                  ((long)&(this->super_ListRecord).metadata.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl,
             *(int *)&(this->super_ListRecord).metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>);
  return;
}

Assistant:

Base( ListRecord&& list ) :
  ListRecord( std::move( list ) ) {

  verifySorted( this->energies() | ranges::views::drop_exactly( this->ND() ),
                "Energy" );
  verifySize( this->NW(), this->NA(), this->NEP() );
}